

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaWorker.cpp
# Opt level: O3

void __thiscall xmrig::CudaWorker::start(CudaWorker *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  int *piVar7;
  uint uVar8;
  uint32_t foundCount;
  uint32_t foundNonce [10];
  uint local_5c;
  timespec local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  do {
    if (DAT_001aee50 == 0) {
      return;
    }
    if (((Nonce::m_paused & 1) != 0) || ((ready & 1) == 0)) {
      do {
        local_58.tv_sec = 0;
        local_58.tv_nsec = 200000000;
        do {
          iVar3 = nanosleep(&local_58,&local_58);
          if (iVar3 != -1) break;
          piVar7 = __errno_location();
        } while (*piVar7 == 4);
      } while ((((Nonce::m_paused & 1) != 0) || ((ready & 1) == 0)) && (DAT_001aee50 != 0));
      if (DAT_001aee50 == 0) {
        return;
      }
      bVar2 = consumeJob(this);
      if (!bVar2) {
        return;
      }
    }
    while (DAT_001aee50 == (this->m_job).m_sequence) {
      local_48 = 0;
      uStack_40 = 0;
      local_58.tv_sec = 0;
      local_58.tv_nsec = 0;
      local_38 = 0;
      local_5c = 0;
      iVar3 = (*this->m_runner->_vptr_ICudaRunner[4])
                        (this->m_runner,
                         (ulong)*(uint *)((this->m_job).m_blobs[(this->m_job).m_index] + 0x27),
                         &local_5c,&local_58);
      if ((char)iVar3 == '\0') {
        return;
      }
      if ((ulong)local_5c != 0) {
        bVar1 = (this->m_job).m_index;
        JobResults::submit((Job *)((this->m_job).m_jobs[0].m_blob +
                                  (ulong)bVar1 * 0x100 + (ulong)bVar1 * 8 + -0x78),
                           (uint32_t *)&local_58,(ulong)local_5c);
      }
      uVar4 = (*(this->super_Worker).super_IWorker._vptr_IWorker[5])(this);
      uVar8 = (int)(0x8000 / (ulong)uVar4) + 1;
      bVar1 = (this->m_job).m_index;
      uVar5 = (this->m_job).m_rounds[bVar1] + 1;
      (this->m_job).m_rounds[bVar1] = uVar5;
      uVar6 = *(uint32_t *)((this->m_job).m_blobs[bVar1] + 0x27);
      if (uVar5 % uVar8 == 0) {
        uVar6 = Nonce::next(bVar1,uVar6,uVar8 * uVar4);
        *(uint32_t *)((this->m_job).m_blobs[(this->m_job).m_index] + 0x27) = uVar6;
      }
      else {
        *(uint32_t *)((this->m_job).m_blobs[bVar1] + 0x27) = uVar6 + uVar4;
      }
      storeStats(this);
      sched_yield();
    }
    bVar2 = consumeJob(this);
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void xmrig::CudaWorker::start()
{
    while (Nonce::sequence(Nonce::CUDA) > 0) {
        if (!isReady()) {
            do {
                std::this_thread::sleep_for(std::chrono::milliseconds(200));
            }
            while (!isReady() && Nonce::sequence(Nonce::CUDA) > 0);

            if (Nonce::sequence(Nonce::CUDA) == 0) {
                break;
            }

            if (!consumeJob()) {
                return;
            }
        }

        while (!Nonce::isOutdated(Nonce::CUDA, m_job.sequence())) {
            uint32_t foundNonce[10] = { 0 };
            uint32_t foundCount     = 0;

            if (!m_runner->run(*m_job.nonce(), &foundCount, foundNonce)) {
                return;
            }

            if (foundCount) {
                JobResults::submit(m_job.currentJob(), foundNonce, foundCount);
            }

            const size_t batch_size = intensity();
            m_job.nextRound(roundSize(batch_size), batch_size);

            storeStats();
            std::this_thread::yield();
        }

        if (!consumeJob()) {
            return;
        }
    }
}